

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O3

uint md_link_label_hash(MD_CHAR *label,MD_SIZE size)

{
  char cVar1;
  uint off;
  uint codepoint;
  int iVar2;
  size_t i;
  long lVar3;
  uint uVar4;
  long in_FS_OFFSET;
  MD_SIZE char_size;
  MD_SIZE local_50;
  undefined4 local_4c;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  off = md_skip_unicode_whitespace(label,0,size);
  uVar4 = 0x811c9dc5;
  while (off < size) {
    local_50 = 0xaaaaaaaa;
    codepoint = md_decode_utf8__(label + off,size - off,&local_50);
    iVar2 = md_is_unicode_whitespace__(codepoint);
    if (((iVar2 == 0) && (cVar1 = label[off], cVar1 != '\r')) && (cVar1 != '\n')) {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      md_get_unicode_fold_info(codepoint,(MD_UNICODE_FOLD_INFO *)local_48);
      if ((ulong)local_48._8_8_ >> 0x20 != 0) {
        lVar3 = 0;
        do {
          uVar4 = ((byte)local_48[lVar3] ^ uVar4) * 0x1000193;
          lVar3 = lVar3 + 1;
        } while (((ulong)local_48._8_8_ >> 0x20) << 2 != lVar3);
      }
      off = off + local_50;
    }
    else {
      local_4c = 0x20;
      lVar3 = 0;
      do {
        uVar4 = (*(byte *)((long)&local_4c + lVar3) ^ uVar4) * 0x1000193;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      off = md_skip_unicode_whitespace(label,off,size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

static unsigned
md_link_label_hash(const CHAR* label, SZ size)
{
    unsigned hash = MD_FNV1A_BASE;
    OFF off;
    unsigned codepoint;
    int is_whitespace = FALSE;

    off = md_skip_unicode_whitespace(label, 0, size);
    while(off < size) {
        SZ char_size;

        codepoint = md_decode_unicode(label, off, size, &char_size);
        is_whitespace = ISUNICODEWHITESPACE_(codepoint) || ISNEWLINE_(label[off]);

        if(is_whitespace) {
            codepoint = ' ';
            hash = md_fnv1a(hash, &codepoint, sizeof(unsigned));
            off = md_skip_unicode_whitespace(label, off, size);
        } else {
            MD_UNICODE_FOLD_INFO fold_info;

            md_get_unicode_fold_info(codepoint, &fold_info);
            hash = md_fnv1a(hash, fold_info.codepoints, fold_info.n_codepoints * sizeof(unsigned));
            off += char_size;
        }
    }

    return hash;
}